

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O2

void __thiscall SpanList::pop(SpanList *this,Span *pSpan)

{
  Span *pSVar1;
  Span *pSVar2;
  Span *pSVar3;
  
  if (pSpan != (Span *)0x0 && this->list != (Span *)0x0) {
    if (this->list == pSpan) {
      pSVar2 = this->list;
      pSVar3 = pSVar2->next;
      if (pSVar3 == pSVar2) {
        pSVar3 = (Span *)0x0;
      }
      else {
        pSVar1 = pSVar2->prev;
        pSVar1->next = pSVar3;
        pSVar2->next->prev = pSVar1;
      }
      this->list = pSVar3;
      return;
    }
    pSVar2 = pSpan->next;
    pSVar3 = pSpan->prev;
    pSVar3->next = pSVar2;
    pSVar2->prev = pSVar3;
  }
  return;
}

Assistant:

void SpanList::pop(Span *pSpan) {
  // 当链表为空 时
  if (list == nullptr || pSpan == nullptr) {
    return;
  }
  if (list == pSpan) { // 当pSpan是链表头时, 可调用其他接口直接实现.
                       // 这种情况也包含了只有一个元素的情况
    this->popFront();
  } else { // 当节点在链表的其他部位时
    pSpan->prev->next = pSpan->next;
    pSpan->next->prev = pSpan->prev;
  }
}